

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbePmaReaderSeek(SortSubtask *pTask,PmaReader *pReadr,SorterFile *pFile,i64 iOff)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  SorterFile *in_RCX;
  SortSubtask *in_RDX;
  long *in_RSI;
  long in_RDI;
  int nRead;
  int iBuf;
  int pgsz;
  int rc;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar4;
  undefined4 uVar5;
  int local_4;
  
  uVar5 = 0;
  iVar1 = sqlite3FaultSim(0);
  if (iVar1 == 0) {
    if (in_RSI[8] != 0) {
      sqlite3OsUnfetch((sqlite3_file *)CONCAT44(uVar5,in_stack_ffffffffffffffd0),
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (void *)0x19aff3);
      in_RSI[8] = 0;
    }
    *in_RSI = (long)in_RCX;
    in_RSI[1] = *(long *)&in_RDX->bDone;
    in_RSI[3] = (long)in_RDX->pThread;
    local_4 = vdbeSorterMapFile(in_RDX,in_RCX,(u8 **)CONCAT44(uVar5,in_stack_ffffffffffffffd0));
    if ((local_4 == 0) && (in_RSI[8] == 0)) {
      uVar4 = *(uint *)(*(long *)(in_RDI + 0x10) + 0xc);
      iVar1 = (int)(*in_RSI % (long)(int)uVar4);
      if (in_RSI[6] == 0) {
        pvVar3 = sqlite3Malloc((ulong)uVar4);
        in_RSI[6] = (long)pvVar3;
        if (in_RSI[6] == 0) {
          local_4 = 7;
        }
        *(uint *)(in_RSI + 7) = uVar4;
      }
      if ((local_4 == 0) && (iVar1 != 0)) {
        iVar2 = uVar4 - iVar1;
        if (in_RSI[1] < *in_RSI + (long)iVar2) {
          iVar2 = (int)in_RSI[1] - (int)*in_RSI;
        }
        local_4 = sqlite3OsRead((sqlite3_file *)in_RDX,in_RCX,0,CONCAT44(iVar1,iVar2));
      }
    }
  }
  else {
    local_4 = 0x10a;
  }
  return local_4;
}

Assistant:

static int vdbePmaReaderSeek(
  SortSubtask *pTask,             /* Task context */
  PmaReader *pReadr,              /* Reader whose cursor is to be moved */
  SorterFile *pFile,              /* Sorter file to read from */
  i64 iOff                        /* Offset in pFile */
){
  int rc = SQLITE_OK;

  assert( pReadr->pIncr==0 || pReadr->pIncr->bEof==0 );

  if( sqlite3FaultSim(201) ) return SQLITE_IOERR_READ;
  if( pReadr->aMap ){
    sqlite3OsUnfetch(pReadr->pFd, 0, pReadr->aMap);
    pReadr->aMap = 0;
  }
  pReadr->iReadOff = iOff;
  pReadr->iEof = pFile->iEof;
  pReadr->pFd = pFile->pFd;

  rc = vdbeSorterMapFile(pTask, pFile, &pReadr->aMap);
  if( rc==SQLITE_OK && pReadr->aMap==0 ){
    int pgsz = pTask->pSorter->pgsz;
    int iBuf = pReadr->iReadOff % pgsz;
    if( pReadr->aBuffer==0 ){
      pReadr->aBuffer = (u8*)sqlite3Malloc(pgsz);
      if( pReadr->aBuffer==0 ) rc = SQLITE_NOMEM_BKPT;
      pReadr->nBuffer = pgsz;
    }
    if( rc==SQLITE_OK && iBuf ){
      int nRead = pgsz - iBuf;
      if( (pReadr->iReadOff + nRead) > pReadr->iEof ){
        nRead = (int)(pReadr->iEof - pReadr->iReadOff);
      }
      rc = sqlite3OsRead(
          pReadr->pFd, &pReadr->aBuffer[iBuf], nRead, pReadr->iReadOff
      );
      testcase( rc!=SQLITE_OK );
    }
  }

  return rc;
}